

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  uint fd;
  int iVar1;
  uint __fd;
  int *piVar2;
  __sighandler_t p_Var3;
  ulong uVar4;
  int __oflag;
  ulong uVar5;
  sigset_t *__set;
  char **__argv;
  uint uVar6;
  sigset_t set;
  uint local_bc;
  sigset_t local_b0;
  
  uVar5 = (ulong)(uint)stdio_count;
  if ((options->flags & 8) != 0) {
    setsid();
  }
  __oflag = (int)uVar5;
  if (0 < stdio_count) {
    uVar4 = 0;
    do {
      if ((uint)pipes[uVar4][1] < uVar4) {
        uVar5 = 0;
        iVar1 = fcntl64((ulong)(uint)pipes[uVar4][1],0,stdio_count);
        __oflag = (int)uVar5;
        pipes[uVar4][1] = iVar1;
        if (iVar1 == -1) goto LAB_00118fd9;
      }
      __oflag = (int)uVar5;
      uVar4 = uVar4 + 1;
    } while ((uint)stdio_count != uVar4);
    if (0 < stdio_count) {
      uVar6 = 0;
      do {
        __fd = pipes[(int)uVar6][1];
        local_bc = error_fd;
        if ((int)__fd < 0) {
          if ((int)uVar6 < 3) {
            __oflag = (uint)(uVar6 != 0) * 2;
            __fd = open64("/dev/null",__oflag);
            fd = __fd;
            if (-1 < (int)__fd) goto LAB_00118ea3;
            goto LAB_00118fe1;
          }
        }
        else {
          fd = pipes[(int)uVar6][0];
LAB_00118ea3:
          if (uVar6 == __fd) {
            uVar5 = 0;
            uv__cloexec_fcntl(uVar6,0);
          }
          else {
            uVar5 = (ulong)uVar6;
            uVar6 = dup2(__fd,uVar6);
            __oflag = (int)uVar5;
            if (uVar6 == 0xffffffff) goto LAB_00118fe1;
          }
          if ((int)uVar6 < 3) {
            uVar5 = 0;
            uv__nonblock_fcntl(uVar6,0);
          }
          if (stdio_count <= (int)fd) {
            uv__close(fd);
          }
        }
        __oflag = (int)uVar5;
        uVar6 = uVar6 + 1;
      } while ((int)uVar6 < stdio_count);
      if (0 < stdio_count) {
        uVar4 = 0;
        do {
          if (stdio_count <= pipes[uVar4][1]) {
            uv__close(pipes[uVar4][1]);
          }
          __oflag = (int)uVar5;
          uVar4 = uVar4 + 1;
        } while ((uint)stdio_count != uVar4);
      }
    }
  }
  if (options->cwd != (char *)0x0) {
    iVar1 = chdir(options->cwd);
    if (iVar1 != 0) goto LAB_00118fd9;
  }
  uVar6 = options->flags;
  if ((uVar6 & 3) != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    __oflag = 0;
    setgroups(0,(__gid_t *)0x0);
    *piVar2 = iVar1;
    uVar6 = options->flags;
  }
  if ((uVar6 & 2) != 0) {
    iVar1 = setgid(options->gid);
    if (iVar1 != 0) goto LAB_00118fd9;
    uVar6 = options->flags;
  }
  if ((uVar6 & 1) != 0) {
    iVar1 = setuid(options->uid);
    if (iVar1 != 0) goto LAB_00118fd9;
  }
  if (options->env != (char **)0x0) {
    _environ = options->env;
  }
  iVar1 = 1;
  do {
    if ((iVar1 != 9) && (iVar1 != 0x13)) {
      __oflag = 0;
      p_Var3 = signal(iVar1,(__sighandler_t)0x0);
      if (p_Var3 == (__sighandler_t)0xffffffffffffffff) goto LAB_00118fd9;
    }
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x20);
  __set = &local_b0;
  sigemptyset(__set);
  iVar1 = pthread_sigmask(2,__set,(__sigset_t *)0x0);
  __oflag = (int)__set;
  if (iVar1 == 0) {
    __argv = options->args;
    execvp(options->file,__argv);
    __oflag = (int)__argv;
  }
LAB_00118fd9:
  uv__write_errno(error_fd);
LAB_00118fe1:
  uVar5 = (ulong)local_bc;
  uv__write_errno(local_bc);
  uv_kill(*(int *)(uVar5 + 0x68),__oflag);
  return;
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t set;
  int close_fd;
  int use_fd;
  int err;
  int fd;
  int n;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

  if (options->env != NULL) {
    environ = options->env;
  }

  /* Reset signal disposition.  Use a hard-coded limit because NSIG
   * is not fixed on Linux: it's either 32, 34 or 64, depending on
   * whether RT signals are enabled.  We are not allowed to touch
   * RT signal handlers, glibc uses them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  /* Reset signal mask. */
  sigemptyset(&set);
  err = pthread_sigmask(SIG_SETMASK, &set, NULL);

  if (err != 0)
    uv__write_errno(error_fd);

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif

  uv__write_errno(error_fd);
}